

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void __thiscall tinygltf::Material::Material(Material *this)

{
  _Rb_tree_header *p_Var1;
  initializer_list<double> __l;
  allocator_type local_51 [9];
  double local_48 [3];
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_48[2] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  __l._M_len = 3;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector(&this->emissiveFactor,__l,local_51);
  (this->alphaMode)._M_dataplus._M_p = (pointer)&(this->alphaMode).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->alphaMode,"OPAQUE","");
  this->alphaCutoff = 0.5;
  this->doubleSided = false;
  (this->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  PbrMetallicRoughness::PbrMetallicRoughness(&this->pbrMetallicRoughness);
  NormalTextureInfo::NormalTextureInfo(&this->normalTexture);
  OcclusionTextureInfo::OcclusionTextureInfo(&this->occlusionTexture);
  TextureInfo::TextureInfo(&this->emissiveTexture);
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->additionalValues)._M_t._M_impl.super__Rb_tree_header;
  (this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->extras).type_ = 0;
  (this->extras).int_value_ = 0;
  (this->extras).real_value_ = 0.0;
  (this->extras).string_value_._M_dataplus._M_p = (pointer)&(this->extras).string_value_.field_2;
  (this->extras).string_value_._M_string_length = 0;
  (this->extras).string_value_.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->extras).object_value_._M_t._M_impl.super__Rb_tree_header;
  (this->extras).object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extras).object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->extras).array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extras).array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extras).binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extras).array_value_.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extras).binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extras).binary_value_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extras).object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->extras).object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->extras).object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->extras).boolean_value_ = false;
  (this->extras_json_string)._M_dataplus._M_p = (pointer)&(this->extras_json_string).field_2;
  (this->extras_json_string)._M_string_length = 0;
  (this->extras_json_string).field_2._M_local_buf[0] = '\0';
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)&(this->extensions_json_string).field_2
  ;
  (this->extensions_json_string)._M_string_length = 0;
  (this->extensions_json_string).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Material() = default;